

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O1

void __thiscall pbrt::ThreadPool::RemoveFromJobList(ThreadPool *this,ParallelJob *job)

{
  ParallelJob *pPVar1;
  ThreadPool *pTVar2;
  
  pPVar1 = job->prev;
  pTVar2 = (ThreadPool *)&pPVar1->next;
  if (pPVar1 == (ParallelJob *)0x0) {
    pTVar2 = this;
  }
  pTVar2->jobList = job->next;
  if (job->next != (ParallelJob *)0x0) {
    job->next->prev = pPVar1;
  }
  job->removed = true;
  return;
}

Assistant:

void ThreadPool::RemoveFromJobList(ParallelJob *job) {
    DCHECK(!job->removed);

    if (job->prev != nullptr) {
        job->prev->next = job->next;
    } else {
        DCHECK(jobList == job);
        jobList = job->next;
    }
    if (job->next != nullptr)
        job->next->prev = job->prev;

    job->removed = true;
}